

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12f03c8::InfoWriter::SetConfig(InfoWriter *this,string *key,ConfigString *cfgStr)

{
  __node_base *p_Var1;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string local_50;
  
  Set(this,key,&cfgStr->Default);
  p_Var1 = &(cfgStr->Config)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    local_80.View_._M_str = (key->_M_dataplus)._M_p;
    local_80.View_._M_len = key->_M_string_length;
    local_b0.View_._M_len = 1;
    local_b0.View_._M_str = local_b0.Digits_;
    local_b0.Digits_[0] = '_';
    cmStrCat<std::__cxx11::string>
              (&local_50,&local_80,&local_b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1));
    Set(this,&local_50,(string *)(p_Var1 + 5));
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void InfoWriter::SetConfig(std::string const& key,
                           cmQtAutoGenInitializer::ConfigString const& cfgStr)
{
  this->Set(key, cfgStr.Default);
  for (auto const& item : cfgStr.Config) {
    this->Set(cmStrCat(key, '_', item.first), item.second);
  }
}